

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnOtherChat(RenX_LoggingPlugin *this,Server *server,string_view raw)

{
  code *pcVar1;
  string msg;
  undefined8 local_48;
  long local_40;
  
  if ((*(uint *)&this->field_0xa0 >> 0x11 & 1) == 0) {
    pcVar1 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar1 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&local_48,&this->otherChatFmt);
  if (local_40 != 0) {
    RenX::processTags((string *)&local_48,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    RenX::replace_tag(&local_48,*(undefined8 *)(RenX::tags + 0x1510),
                      *(undefined8 *)(RenX::tags + 0x1508),raw._M_len,raw._M_str);
    (*pcVar1)(server,local_40,local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnOtherChat(RenX::Server &server, std::string_view raw)
{
	logFuncType func;
	if (RenX_LoggingPlugin::otherChatPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->otherChatFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, raw);
		(server.*func)(msg);
	}
}